

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

int sylvan_sat_one(BDD bdd,BDDSET vars,uint8_t *str)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  mtbddnode_t n;
  mtbddnode_t n_00;
  MTBDD MVar4;
  mtbddnode_t n_bdd;
  mtbddnode_t n_vars;
  uint8_t *str_local;
  BDDSET vars_local;
  BDD bdd_local;
  
  if (bdd == 0) {
    bdd_local._4_4_ = 0;
  }
  else if (str == (uint8_t *)0x0) {
    bdd_local._4_4_ = 0;
  }
  else {
    iVar1 = mtbdd_set_isempty(vars);
    n_vars = (mtbddnode_t)str;
    str_local = (uint8_t *)vars;
    vars_local = bdd;
    if (iVar1 == 0) {
      while( true ) {
        n = MTBDD_GETNODE((MTBDD)str_local);
        if (vars_local == 0x8000000000000000) {
          *(undefined1 *)&n_vars->a = 0;
        }
        else {
          n_00 = MTBDD_GETNODE(vars_local);
          uVar2 = mtbddnode_getvariable(n_00);
          uVar3 = mtbddnode_getvariable(n);
          if (uVar2 == uVar3) {
            MVar4 = mtbddnode_followlow(vars_local,n_00);
            if (MVar4 == 0) {
              *(undefined1 *)&n_vars->a = 1;
              vars_local = mtbddnode_followhigh(vars_local,n_00);
            }
            else {
              *(undefined1 *)&n_vars->a = 0;
              vars_local = mtbddnode_followlow(vars_local,n_00);
            }
          }
          else {
            *(undefined1 *)&n_vars->a = 0;
          }
        }
        str_local = (uint8_t *)mtbddnode_followhigh((MTBDD)str_local,n);
        iVar1 = mtbdd_set_isempty((MTBDD)str_local);
        if (iVar1 != 0) break;
        n_vars = (mtbddnode_t)((long)&n_vars->a + 1);
      }
      bdd_local._4_4_ = 1;
    }
    else {
      bdd_local._4_4_ = 1;
    }
  }
  return bdd_local._4_4_;
}

Assistant:

int
sylvan_sat_one(BDD bdd, BDDSET vars, uint8_t *str)
{
    if (bdd == sylvan_false) return 0;
    if (str == NULL) return 0;
    if (sylvan_set_isempty(vars)) return 1;

    for (;;) {
        bddnode_t n_vars = MTBDD_GETNODE(vars);
        if (bdd == sylvan_true) {
            *str = 0;
        } else {
            bddnode_t n_bdd = MTBDD_GETNODE(bdd);
            if (bddnode_getvariable(n_bdd) != bddnode_getvariable(n_vars)) {
                *str = 0;
            } else {
                if (node_low(bdd, n_bdd) == sylvan_false) {
                    // take high edge
                    *str = 1;
                    bdd = node_high(bdd, n_bdd);
                } else {
                    // take low edge
                    *str = 0;
                    bdd = node_low(bdd, n_bdd);
                }
            }
        }
        vars = node_high(vars, n_vars);
        if (sylvan_set_isempty(vars)) break;
        str++;
    }

    return 1;
}